

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxwritestate.hpp
# Opt level: O2

bool __thiscall
soplex::SPxSolverBase<double>::writeState
          (SPxSolverBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          bool cpxFormat,bool writeZeroObjective)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  double *pdVar3;
  undefined1 uVar4;
  char *pcVar5;
  char *pcVar6;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  Real RVar7;
  double dVar8;
  allocator local_299;
  undefined4 local_298;
  undefined4 local_294;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string ofname;
  ofstream ofs;
  byte abStack_210 [480];
  
  local_294 = (undefined4)CONCAT71(in_register_00000089,writeZeroObjective);
  ofname._M_dataplus._M_p = (pointer)&ofname.field_2;
  ofname._M_string_length = 0;
  ofname.field_2._M_local_buf[0] = '\0';
  std::ofstream::ofstream(&ofs);
  std::__cxx11::string::string((string *)&local_290,filename,&local_299);
  local_298 = (undefined4)CONCAT71(in_register_00000081,cpxFormat);
  std::operator+(&local_270,&local_290,".set");
  std::__cxx11::string::operator=((string *)&ofname,(string *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::ofstream::open((char *)&ofs,(_Ios_Openmode)ofname._M_dataplus._M_p);
  if ((abStack_210[*(long *)(_ofs + -0x18)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)&ofs,"# SoPlex version ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,8);
    poVar2 = std::operator<<(poVar2,".");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
    poVar2 = std::operator<<(poVar2,".");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&ofs,"# run SoPlex as follows:");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&ofs,
                             "# bin/soplex --loadset=spxcheck.set --readbas=spxcheck.bas spxcheck.mps\n"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&ofs,"int:representation = ");
    pcVar5 = "1";
    pcVar6 = 
    "7.275957614183425903320312500000000000000000000000000000000000000000000000000000000000000000000000000e-12"
    ;
    if (this->theRep == COLUMN) {
      pcVar6 = 
      "5.820766091346740722656250000000000000000000000000000000000000000000000000000000000000000000000000000e-11"
      ;
    }
    poVar2 = std::operator<<(poVar2,pcVar6 + 0x68);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&ofs,"int:factor_update_max = ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar2,(this->super_SPxBasisBase<double>).maxUpdates);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&ofs,"int:pricer = ");
    iVar1 = (**this->thepricer->_vptr_SPxPricer)();
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"Auto");
    if (iVar1 == 0) {
      pcVar5 = " 0";
LAB_001871a1:
      poVar2 = std::operator<<((ostream *)&ofs,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      iVar1 = (**this->thepricer->_vptr_SPxPricer)();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_00,iVar1),"Dantzig");
      if (iVar1 == 0) goto LAB_001871a1;
      iVar1 = (**this->thepricer->_vptr_SPxPricer)();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_01,iVar1),"ParMult");
      pcVar5 = "2";
      if (iVar1 == 0) goto LAB_001871a1;
      iVar1 = (**this->thepricer->_vptr_SPxPricer)();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_02,iVar1),"Devex");
      if (iVar1 == 0) {
        pcVar5 = "3";
        goto LAB_001871a1;
      }
      iVar1 = (**this->thepricer->_vptr_SPxPricer)();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_03,iVar1),"Steep");
      if (iVar1 == 0) {
        pcVar5 = "4";
        goto LAB_001871a1;
      }
      iVar1 = (**this->thepricer->_vptr_SPxPricer)();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_04,iVar1),"SteepEx");
      if (iVar1 == 0) {
        pcVar5 = "5";
        goto LAB_001871a1;
      }
    }
    std::operator<<((ostream *)&ofs,"int:ratiotester = ");
    iVar1 = (**this->theratiotester->_vptr_SPxRatioTester)();
    iVar1 = strcmp((char *)CONCAT44(extraout_var_05,iVar1),"Default");
    if (iVar1 == 0) {
      pcVar6 = "0";
LAB_00187265:
      poVar2 = std::operator<<((ostream *)&ofs,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      iVar1 = (**this->theratiotester->_vptr_SPxRatioTester)();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_06,iVar1),"Harris");
      if (iVar1 == 0) {
        pcVar6 = "1";
        goto LAB_00187265;
      }
      iVar1 = (**this->theratiotester->_vptr_SPxRatioTester)();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_07,iVar1),"Fast");
      if (iVar1 == 0) {
        pcVar6 = "2";
        goto LAB_00187265;
      }
      iVar1 = (**this->theratiotester->_vptr_SPxRatioTester)();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_08,iVar1),"Bound Flipping");
      if (iVar1 == 0) {
        pcVar6 = "3";
        goto LAB_00187265;
      }
    }
    std::operator<<((ostream *)&ofs,"real:feastol = ");
    RVar7 = Tolerances::floatingPointFeastol
                      ((this->super_SPxLPBase<double>)._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    poVar2 = std::ostream::_M_insert<double>(RVar7);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&ofs,"real:opttol = ");
    RVar7 = Tolerances::floatingPointOpttol
                      ((this->super_SPxLPBase<double>)._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    poVar2 = std::ostream::_M_insert<double>(RVar7);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&ofs,"real:epsilon_zero = ");
    dVar8 = epsilon(this);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&ofs,"real:infty = ");
    pdVar3 = (double *)infinity();
    poVar2 = std::ostream::_M_insert<double>(*pdVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&ofs,"uint:random_seed = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ofstream::close();
    std::__cxx11::string::string((string *)&local_290,filename,&local_299);
    std::operator+(&local_270,&local_290,".mps");
    std::__cxx11::string::operator=((string *)&ofname,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::ofstream::open((char *)&ofs,(_Ios_Openmode)ofname._M_dataplus._M_p);
    if ((abStack_210[*(long *)(_ofs + -0x18)] & 5) == 0) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x21])
                (this,&ofs,rowNames,colNames,0,(ulong)(byte)local_294);
      std::ofstream::close();
      std::__cxx11::string::string((string *)&local_290,filename,&local_299);
      std::operator+(&local_270,&local_290,".bas");
      std::__cxx11::string::operator=((string *)&ofname,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      iVar1 = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5b])
                        (this,ofname._M_dataplus._M_p,rowNames,colNames,(ulong)(byte)local_298);
      uVar4 = (undefined1)iVar1;
      goto LAB_001873d7;
    }
  }
  uVar4 = 0;
LAB_001873d7:
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&ofname);
  return (bool)uVar4;
}

Assistant:

bool SPxSolverBase<R>::writeState(
   const char*    filename,
   const NameSet* rowNames,
   const NameSet* colNames,
   const bool     cpxFormat,
   const bool     writeZeroObjective
) const
{

   std::string ofname;
   std::ofstream ofs;

   // write parameter settings
   ofname = std::string(filename) + ".set";
   ofs.open(ofname.c_str());

   if(!ofs)
      return false;

   ofs << "# SoPlex version " << SOPLEX_VERSION / 100
       << "." << (SOPLEX_VERSION / 10) % 10
       << "." << SOPLEX_VERSION % 10 << std::endl << std::endl;
   ofs << "# run SoPlex as follows:" << std::endl;
   ofs << "# bin/soplex --loadset=spxcheck.set --readbas=spxcheck.bas spxcheck.mps\n" << std::endl;
   ofs << "int:representation = " << (rep() == SPxSolverBase<R>::COLUMN ? "1" : "2") << std::endl;
   ofs << "int:factor_update_max = " << basis().getMaxUpdates() << std::endl;
   ofs << "int:pricer = ";

   if(!strcmp(pricer()->getName(), "Auto"))
      ofs << " 0" << std::endl;
   else if(!strcmp(pricer()->getName(), "Dantzig"))
      ofs << "1" << std::endl;
   else if(!strcmp(pricer()->getName(), "ParMult"))
      ofs << "2" << std::endl;
   else if(!strcmp(pricer()->getName(), "Devex"))
      ofs << "3" << std::endl;
   else if(!strcmp(pricer()->getName(), "Steep"))
      ofs << "4" << std::endl;
   else if(!strcmp(pricer()->getName(), "SteepEx"))
      ofs << "5" << std::endl;

   ofs << "int:ratiotester = ";

   if(!strcmp(ratiotester()->getName(), "Default"))
      ofs << "0" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Harris"))
      ofs << "1" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Fast"))
      ofs << "2" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Bound Flipping"))
      ofs << "3" << std::endl;

   ofs << "real:feastol = " << tolerances()->floatingPointFeastol() << std::endl;
   ofs << "real:opttol = " << tolerances()->floatingPointOpttol() << std::endl;
   ofs << "real:epsilon_zero = " << epsilon() << std::endl;
   ofs << "real:infty = " << infinity << std::endl;
   ofs << "uint:random_seed = " << random.getSeed() << std::endl;
   ofs.close();

   // write LP
   ofname = std::string(filename) + ".mps";
   ofs.open(ofname.c_str());

   if(!ofs)
      return false;

   this->writeMPS(ofs, rowNames, colNames, nullptr, writeZeroObjective);
   ofs.close();

   // write basis
   ofname = std::string(filename) + ".bas";
   return writeBasisFile(ofname.c_str(), rowNames, colNames, cpxFormat);
}